

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O0

int ebur128_set_channel(ebur128_state *st,uint channel_number,int value)

{
  int value_local;
  uint channel_number_local;
  ebur128_state *st_local;
  
  if (channel_number < st->channels) {
    if ((value == 6) && ((st->channels != 1 || (channel_number != 0)))) {
      fprintf(_stderr,"EBUR128_DUAL_MONO only works with mono files!\n");
      st_local._4_4_ = 3;
    }
    else {
      st->d->channel_map[channel_number] = value;
      st_local._4_4_ = 0;
    }
  }
  else {
    st_local._4_4_ = 3;
  }
  return st_local._4_4_;
}

Assistant:

int ebur128_set_channel(ebur128_state* st,
                        unsigned int channel_number,
                        int value) {
  if (channel_number >= st->channels) {
    return EBUR128_ERROR_INVALID_CHANNEL_INDEX;
  }
  if (value == EBUR128_DUAL_MONO &&
      (st->channels != 1 || channel_number != 0)) {
    fprintf(stderr, "EBUR128_DUAL_MONO only works with mono files!\n");
    return EBUR128_ERROR_INVALID_CHANNEL_INDEX;
  }
  st->d->channel_map[channel_number] = value;
  return EBUR128_SUCCESS;
}